

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_getter.cpp
# Opt level: O1

void GetAllCaptureMovements(Situation *situation,int *num_of_all_movements,Movement *all_movements)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  
  uVar4 = situation->current_player;
  lVar6 = (long)(int)uVar4;
  iVar7 = uVar4 * 0x10;
  uVar14 = (ulong)(iVar7 + 0x10);
  bVar1 = situation->current_pieces[uVar14];
  if (bVar1 != 0) {
    iVar9 = *(int *)((long)KING_CAN_GET[0][lVar6] + (ulong)((uint)bVar1 * 0x50));
    if (iVar9 != 0) {
      iVar11 = *num_of_all_movements;
      piVar13 = (int *)((long)KING_CAN_GET[0][lVar6] + (ulong)((uint)bVar1 * 0x50) + 4);
      do {
        bVar2 = situation->current_board[iVar9];
        if ((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) {
          all_movements[iVar11].capture = bVar2;
          all_movements[iVar11].from = bVar1;
          all_movements[iVar11].to = (UINT8)iVar9;
          all_movements[iVar11].catc = '\0';
          all_movements[iVar11].movec = '\0';
          iVar11 = iVar11 + 1;
          *num_of_all_movements = iVar11;
        }
        iVar9 = *piVar13;
        piVar13 = piVar13 + 1;
      } while (iVar9 != 0);
    }
  }
  iVar9 = *num_of_all_movements;
  uVar10 = uVar14 | 1;
  do {
    bVar1 = situation->current_pieces[uVar10];
    if (bVar1 != 0) {
      iVar11 = *(int *)((long)ADVISOR_CAN_GET[0][lVar6] + (ulong)((uint)bVar1 * 0x50));
      if (iVar11 != 0) {
        piVar13 = (int *)((ulong)((uint)bVar1 * 0x50) + lVar6 * 0x28 + 0x2f4d54);
        do {
          bVar2 = situation->current_board[iVar11];
          if ((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) {
            all_movements[iVar9].capture = bVar2;
            all_movements[iVar9].from = bVar1;
            all_movements[iVar9].to = (UINT8)iVar11;
            all_movements[iVar9].catc = '\0';
            all_movements[iVar9].movec = '\0';
            iVar9 = iVar9 + 1;
            *num_of_all_movements = iVar9;
          }
          iVar11 = *piVar13;
          piVar13 = piVar13 + 1;
        } while (iVar11 != 0);
      }
    }
    bVar5 = (long)uVar10 < (long)(iVar7 + 0x12);
    uVar10 = uVar10 + 1;
  } while (bVar5);
  iVar9 = *num_of_all_movements;
  uVar10 = uVar14 | 3;
  do {
    bVar1 = situation->current_pieces[uVar10];
    if (bVar1 != 0) {
      iVar11 = *(int *)((long)BISHOP_CAN_GET[0][lVar6] + (ulong)((uint)bVar1 * 0x50));
      if (iVar11 != 0) {
        lVar15 = (ulong)((uint)bVar1 * 0x50) + lVar6 * 0x28;
        do {
          bVar2 = situation->current_board[iVar11];
          if (((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) &&
             (situation->current_board[*(int *)((long)BISHOP_EYE[0][0] + lVar15)] == '\0')) {
            all_movements[iVar9].capture = bVar2;
            all_movements[iVar9].from = bVar1;
            all_movements[iVar9].to = (UINT8)iVar11;
            all_movements[iVar9].catc = '\0';
            all_movements[iVar9].movec = '\0';
            iVar9 = iVar9 + 1;
            *num_of_all_movements = iVar9;
          }
          iVar11 = *(int *)((long)BISHOP_CAN_GET[0][0] + lVar15 + 4);
          lVar15 = lVar15 + 4;
        } while (iVar11 != 0);
      }
    }
    bVar5 = (long)uVar10 < (long)(iVar7 + 0x14);
    uVar10 = uVar10 + 1;
  } while (bVar5);
  iVar9 = *num_of_all_movements;
  uVar10 = uVar14 | 5;
  do {
    bVar1 = situation->current_pieces[uVar10];
    if (((ulong)bVar1 != 0) && (iVar11 = HORSE_CAN_GET[bVar1][0], iVar11 != 0)) {
      lVar15 = (ulong)bVar1 * 0x28;
      do {
        bVar2 = situation->current_board[iVar11];
        if (((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) &&
           (situation->current_board[*(int *)((long)HORSE_LEG[0] + lVar15)] == '\0')) {
          all_movements[iVar9].capture = bVar2;
          all_movements[iVar9].from = bVar1;
          all_movements[iVar9].to = (UINT8)iVar11;
          all_movements[iVar9].catc = '\0';
          all_movements[iVar9].movec = '\0';
          iVar9 = iVar9 + 1;
          *num_of_all_movements = iVar9;
        }
        iVar11 = *(int *)((long)HORSE_CAN_GET[0] + lVar15 + 4);
        lVar15 = lVar15 + 4;
      } while (iVar11 != 0);
    }
    bVar5 = (long)uVar10 < (long)(iVar7 + 0x16);
    uVar10 = uVar10 + 1;
  } while (bVar5);
  iVar9 = *num_of_all_movements;
  uVar10 = uVar14 | 7;
  do {
    bVar1 = situation->current_pieces[uVar10];
    if (bVar1 != 0) {
      uVar8 = bVar1 & 0xf;
      uVar3 = situation->bit_row[(uint)(bVar1 >> 4)];
      lVar15 = 0;
      do {
        bVar2 = *(byte *)((ulong)((bVar1 & 0xf) << 0xc) + (ulong)uVar3 * 8 + 0x305d52 + lVar15);
        if (uVar8 != bVar2) {
          uVar16 = (ulong)bVar2 | (ulong)(bVar1 & 0xfffffff0);
          bVar2 = situation->current_board[uVar16];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar9].capture = bVar2;
            all_movements[iVar9].from = bVar1;
            all_movements[iVar9].to = (UINT8)uVar16;
            all_movements[iVar9].catc = '\0';
            all_movements[iVar9].movec = '\0';
            iVar9 = iVar9 + 1;
            *num_of_all_movements = iVar9;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
      uVar3 = situation->bit_col[uVar8];
      lVar15 = 0;
      do {
        bVar2 = *(byte *)((ulong)((bVar1 & 0xf0) << 9) + (ulong)uVar3 * 8 + 0x30bd52 + lVar15);
        if ((uint)(bVar1 >> 4) != (uint)bVar2) {
          uVar12 = (uint)bVar2 << 4 | uVar8;
          bVar2 = situation->current_board[uVar12];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar9].capture = bVar2;
            all_movements[iVar9].from = bVar1;
            all_movements[iVar9].movec = '\0';
            all_movements[iVar9].to = (UINT8)uVar12;
            iVar9 = iVar9 + 1;
            *num_of_all_movements = iVar9;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
    }
    bVar5 = (long)uVar10 < (long)(iVar7 + 0x18);
    uVar10 = uVar10 + 1;
  } while (bVar5);
  iVar9 = *num_of_all_movements;
  uVar10 = uVar14 | 9;
  do {
    bVar1 = situation->current_pieces[uVar10];
    if (bVar1 != 0) {
      uVar8 = bVar1 & 0xf;
      uVar3 = situation->bit_row[(uint)(bVar1 >> 4)];
      lVar15 = 0;
      do {
        bVar2 = *(byte *)((ulong)((bVar1 & 0xf) << 0xc) + (ulong)uVar3 * 8 + 0x305d54 + lVar15);
        if (uVar8 != bVar2) {
          uVar16 = (ulong)bVar2 | (ulong)(bVar1 & 0xfffffff0);
          bVar2 = situation->current_board[uVar16];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar9].capture = bVar2;
            all_movements[iVar9].from = bVar1;
            all_movements[iVar9].to = (UINT8)uVar16;
            all_movements[iVar9].catc = '\0';
            all_movements[iVar9].movec = '\0';
            iVar9 = iVar9 + 1;
            *num_of_all_movements = iVar9;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
      uVar3 = situation->bit_col[uVar8];
      lVar15 = 0;
      do {
        bVar2 = *(byte *)((ulong)((bVar1 & 0xf0) << 9) + (ulong)uVar3 * 8 + 0x30bd54 + lVar15);
        if ((uint)(bVar1 >> 4) != (uint)bVar2) {
          uVar12 = (uint)bVar2 << 4 | uVar8;
          bVar2 = situation->current_board[uVar12];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar9].capture = bVar2;
            all_movements[iVar9].from = bVar1;
            all_movements[iVar9].to = (UINT8)uVar12;
            all_movements[iVar9].catc = '\0';
            all_movements[iVar9].movec = '\0';
            iVar9 = iVar9 + 1;
            *num_of_all_movements = iVar9;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
    }
    bVar5 = (long)uVar10 < (long)(iVar7 + 0x1a);
    uVar10 = uVar10 + 1;
  } while (bVar5);
  iVar9 = *num_of_all_movements;
  uVar14 = uVar14 | 0xb;
  do {
    bVar1 = situation->current_pieces[uVar14];
    if (bVar1 != 0) {
      iVar11 = *(int *)((long)PAWN_CAN_GET[0][lVar6] + (ulong)((uint)bVar1 * 0x50));
      if (iVar11 != 0) {
        piVar13 = (int *)((ulong)((uint)bVar1 * 0x50) + lVar6 * 0x28 + 0x2f9d54);
        do {
          bVar2 = situation->current_board[iVar11];
          if ((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) {
            all_movements[iVar9].capture = bVar2;
            all_movements[iVar9].from = bVar1;
            all_movements[iVar9].to = (UINT8)iVar11;
            all_movements[iVar9].catc = '\0';
            all_movements[iVar9].movec = '\0';
            iVar9 = iVar9 + 1;
            *num_of_all_movements = iVar9;
          }
          iVar11 = *piVar13;
          piVar13 = piVar13 + 1;
        } while (iVar11 != 0);
      }
    }
    bVar5 = (long)uVar14 < (long)(iVar7 + 0x1f);
    uVar14 = uVar14 + 1;
  } while (bVar5);
  return;
}

Assistant:

void GetAllCaptureMovements(const Situation & situation, int & num_of_all_movements, Movement* all_movements){
    // 1. 获得玩家特征值 
    int player_flag = GetPlayerFlag(situation.current_player), player = situation.current_player;
    int piece_from, piece_to, can_move_counter, piece_to_id;
    // 2. 将(帅)的吃子着法
    for(int i = player_flag + 0; i <= player_flag + 0; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = KING_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = KING_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }

    // 3. 士(仕)的吃子着法
    for(int i = player_flag + 1; i <= player_flag + 2; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = ADVISOR_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = ADVISOR_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }
    // 4. 象(相)的吃子着法
    for(int i = player_flag + 3; i <= player_flag + 4; i ++){
        if(situation.current_pieces[i] != 0){
            int bishop_eye;                  // 象眼位置
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = BISHOP_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                bishop_eye = BISHOP_EYE[piece_from][player][can_move_counter];
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player && situation.current_board[bishop_eye] == 0){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = BISHOP_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }

    // 5. 马的吃子着法
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        if(situation.current_pieces[i] != 0){
            int horse_leg;                  // 马腿位置
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = HORSE_CAN_GET[piece_from][can_move_counter];
            while(piece_to != 0){
                horse_leg = HORSE_LEG[piece_from][can_move_counter];
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player && situation.current_board[horse_leg] == 0){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].movec = 0;
                    all_movements[num_of_all_movements].catc = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = HORSE_CAN_GET[piece_from][can_move_counter];
            }
        }
    }

    // 6. 车的吃子着法
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            int col = GetCol(piece_from), row = GetRow(piece_from);

            // 右 左 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_col = ROOK_CANNON_CAN_GET_ROW[col - 3][situation.bit_row[row]].rook_capture[j];
                if(capture_col != col){
                    piece_to = GetPosition(capture_col, row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
            // 下 上 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_row = ROOK_CANNON_CAN_GET_COL[row - 3][situation.bit_col[col]].rook_capture[j];
                if(capture_row != row){
                    piece_to = GetPosition(col, capture_row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].movec = 0;
                        all_movements[num_of_all_movements].to = piece_to;
                        num_of_all_movements ++;
                    }
                }
            }
        
        }
    }
    
    // 7. 炮的吃子着法
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            int col = GetCol(piece_from), row = GetRow(piece_from);

            // 右 左 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_col = ROOK_CANNON_CAN_GET_ROW[col - 3][situation.bit_row[row]].cannon_capture[j];
                if(capture_col != col){
                    piece_to = GetPosition(capture_col, row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
            // 下 上 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_row = ROOK_CANNON_CAN_GET_COL[row - 3][situation.bit_col[col]].cannon_capture[j];
                if(capture_row != row){
                    piece_to = GetPosition(col, capture_row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
        
        }
    }

    // 8. 兵(卒)的吃子着法
    for(int i = player_flag + 11; i <= player_flag + 15; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = PAWN_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = PAWN_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }
}